

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test.cc
# Opt level: O1

string * __thiscall
google::protobuf::util::UnredactedShortDebugFormatForTest_abi_cxx11_
          (string *__return_storage_ptr__,util *this,Message *message)

{
  size_type sVar1;
  Printer printer;
  Printer PStack_88;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&PStack_88);
  PStack_88.single_line_mode_ = true;
  PStack_88.expand_any_ = true;
  if ((int)PStack_88.report_sensitive_fields_ < 0x10) {
    PStack_88.report_sensitive_fields_ = kUnredactedShortDebugFormatForTest;
  }
  TextFormat::Printer::PrintToString(&PStack_88,(Message *)this,__return_storage_ptr__);
  sVar1 = __return_storage_ptr__->_M_string_length;
  if ((sVar1 != 0) && ((__return_storage_ptr__->_M_dataplus)._M_p[sVar1 - 1] == ' ')) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sVar1 + -1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                     *)&PStack_88.custom_message_printers_);
  PStack_88.custom_message_printers_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                     *)&PStack_88.custom_printers_);
  PStack_88.custom_printers_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  if (PStack_88.default_field_value_printer_._M_t.
      super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
      .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
       )0x0) {
    (*(*(_func_int ***)
        PStack_88.default_field_value_printer_._M_t.
        super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
        .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
        _M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnredactedShortDebugFormatForTest(const google::protobuf::Message& message) {
  std::string debug_string;

  google::protobuf::TextFormat::Printer printer;
  printer.SetSingleLineMode(true);
  printer.SetExpandAny(true);
  printer.SetReportSensitiveFields(
      internal::FieldReporterLevel::kUnredactedShortDebugFormatForTest);

  printer.PrintToString(message, &debug_string);
  // Single line mode currently might have an extra space at the end.
  if (!debug_string.empty() && debug_string[debug_string.size() - 1] == ' ') {
    debug_string.resize(debug_string.size() - 1);
  }

  return debug_string;
}